

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall slang::ast::Compilation::Compilation(Compilation *this,Bag *options)

{
  flat_hash_map<syntax::SyntaxKind,_const_Type_*> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _Head_base<0UL,_slang::ast::NetType_*,_false> _Var4;
  undefined8 uVar5;
  flat_hash_map<parsing::TokenKind,_std::unique_ptr<NetType>_> *this_01;
  ScalarType *pSVar6;
  PredefinedIntegerType *pPVar7;
  FloatingType *pFVar8;
  Type *pTVar9;
  PredefinedIntegerType *pPVar10;
  PredefinedIntegerType *pPVar11;
  Type **ppTVar12;
  __uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *p_Var13;
  unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *puVar14;
  PackageSymbol *pPVar15;
  anon_class_8_1_8991fb9c registerScalar;
  undefined1 local_1b8 [8];
  _Head_base<0UL,_slang::ast::NetType_*,_false> local_1b0;
  _Any_data local_1a8 [2];
  Type *local_188;
  TypedBumpAllocator<slang::ast::GenericClassDefSymbol> *local_180;
  CompilationOptions *local_178;
  unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *local_170;
  sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
  *local_168;
  flat_hash_map<parsing::TokenKind,_std::unique_ptr<NetType>_> *local_160;
  flat_hash_map<const_Scope_*,_const_Expression_*> *local_158;
  flat_hash_map<const_Scope_*,_const_Symbol_*> *local_150;
  flat_hash_map<const_Scope_*,_const_Symbol_*> *local_148;
  flat_hash_map<const_PackageSymbol_*,_flat_hash_map<string_view,_const_Symbol_*>_> *local_140;
  ParamOverrideNode *local_138;
  flat_hash_set<const_syntax::BindDirectiveSyntax_*> *local_130;
  flat_hash_map<const_Definition_*,_std::vector<const_syntax::BindDirectiveSyntax_*>_> *local_128;
  flat_hash_map<string_view,_const_PrimitiveSymbol_*> *local_120;
  flat_hash_map<string_view,_const_PrimitiveSymbol_*> *local_118;
  Diagnostic *local_110;
  flat_hash_map<std::tuple<string_view,_string_view,_const_Scope_*>,_std::tuple<const_syntax::SyntaxNode_*,_const_syntax::ScopedNameSyntax_*,_SymbolIndex,_bool>_>
  *local_108;
  DiagMap *local_100;
  flat_hash_map<std::tuple<string_view,_const_Scope_*>,_std::unique_ptr<Definition>_> *local_f8;
  flat_hash_map<const_syntax::ModuleDeclarationSyntax_*,_DefinitionMetadata> *local_f0;
  TypedBumpAllocator<slang::ConstantValue> *local_e8;
  TypedBumpAllocator<ska::flat_hash_map<unsigned_long,_unsigned_long,_slang::Hasher<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_e0;
  TypedBumpAllocator<ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *local_d8;
  flat_hash_set<string_view> *local_d0;
  flat_hash_map<const_void_*,_span<const_AttributeSymbol_*const>_> *local_c8;
  flat_hash_map<std::tuple<string_view,_SymbolKind>,_const_SystemSubroutine_*> *local_c0;
  flat_hash_map<string_view,_const_SystemSubroutine_*> *local_b8;
  flat_hash_map<uint32_t,_const_Type_*> *local_b0;
  flat_hash_map<string_view,_std::pair<const_Definition_*,_bool>_> *local_a8;
  SafeIndexedVector<std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>,_slang::ast::Scope::ImportDataIndex>
  *local_a0;
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>
  *local_98;
  ScalarType *local_90;
  ScalarType *local_88;
  ScalarType *local_80;
  Type *local_78;
  Type *local_70;
  Type *local_68;
  Type *local_60;
  Type *local_58;
  Type *local_50;
  Type *local_48;
  shared_ptr<slang::DiagArgFormatter> local_40;
  
  BumpAllocator::BumpAllocator(&this->super_BumpAllocator);
  Bag::getOrDefault<slang::ast::CompilationOptions>(&this->options,options);
  BumpAllocator::BumpAllocator(&(this->symbolMapAllocator).super_BumpAllocator);
  BumpAllocator::BumpAllocator(&(this->pointerMapAllocator).super_BumpAllocator);
  local_178 = &this->options;
  BumpAllocator::BumpAllocator(&(this->constantAllocator).super_BumpAllocator);
  BumpAllocator::BumpAllocator(&(this->genericClassAllocator).super_BumpAllocator);
  local_98 = &this->deferredData;
  this->scalarTypeTable[6] = (Type *)0x0;
  this->scalarTypeTable[7] = (Type *)0x0;
  this->scalarTypeTable[4] = (Type *)0x0;
  this->scalarTypeTable[5] = (Type *)0x0;
  this->scalarTypeTable[2] = (Type *)0x0;
  this->scalarTypeTable[3] = (Type *)0x0;
  this->scalarTypeTable[0] = (Type *)0x0;
  this->scalarTypeTable[1] = (Type *)0x0;
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>::
  SafeIndexedVector(local_98);
  local_a0 = &this->importData;
  SafeIndexedVector<std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>,_slang::ast::Scope::ImportDataIndex>
  ::SafeIndexedVector(local_a0);
  local_a8 = &this->topDefinitions;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>
  ::sherwood_v3_table(&local_a8->
                       super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>
                     );
  local_b0 = &this->vectorTypeCache;
  local_180 = &this->genericClassAllocator;
  ska::detailv3::
  sherwood_v3_table<std::pair<unsigned_int,_const_slang::ast::Type_*>,_unsigned_int,_slang::Hasher<unsigned_int>,_ska::detailv3::KeyOrValueHasher<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_slang::Hasher<unsigned_int>_>,_std::equal_to<unsigned_int>,_ska::detailv3::KeyOrValueEquality<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_std::equal_to<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>_>
  ::sherwood_v3_table(&local_b0->
                       super_sherwood_v3_table<std::pair<unsigned_int,_const_slang::ast::Type_*>,_unsigned_int,_slang::Hasher<unsigned_int>,_ska::detailv3::KeyOrValueHasher<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_slang::Hasher<unsigned_int>_>,_std::equal_to<unsigned_int>,_ska::detailv3::KeyOrValueEquality<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_std::equal_to<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>_>
                     );
  this_00 = &this->knownTypes;
  ska::detailv3::
  sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
  ::sherwood_v3_table(&this_00->
                       super_sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
                     );
  local_160 = &this->knownNetTypes;
  ska::detailv3::
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>
  ::sherwood_v3_table(&local_160->
                       super_sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>
                     );
  local_168 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
               *)&this->packageMap;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
  ::sherwood_v3_table((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
                       *)local_168);
  local_b8 = &this->subroutineMap;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  ::sherwood_v3_table(&local_b8->
                       super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>_>
                     );
  local_c0 = &this->methodMap;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  ::sherwood_v3_table(&local_c0->
                       super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
                     );
  local_c8 = &this->attributeMap;
  ska::detailv3::
  sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
  ::sherwood_v3_table(&local_c8->
                       super_sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
                     );
  local_d0 = &this->globalInstantiations;
  ska::detailv3::
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::sherwood_v3_table(&local_d0->
                       super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     );
  local_f0 = &this->definitionMetadata;
  local_e8 = &this->constantAllocator;
  local_e0 = &this->pointerMapAllocator;
  local_d8 = &this->symbolMapAllocator;
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>
  ::sherwood_v3_table(&local_f0->
                       super_sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>
                     );
  local_f8 = &this->definitionMap;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
  ::sherwood_v3_table(&local_f8->
                       super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
                     );
  local_100 = &this->diagMap;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
  ::sherwood_v3_table(&local_100->
                       super_sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
                     );
  local_108 = &this->outOfBlockDecls;
  ska::detailv3::sherwood_v3_table<$a9d55d12$>::sherwood_v3_table
            (&local_108->super_sherwood_v3_table<_a9d55d12_>);
  local_170 = &this->root;
  *(undefined8 *)((long)&this->sourceManager + 1) = 0;
  *(undefined8 *)((long)&this->numErrors + 1) = 0;
  (this->root)._M_t.
  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>._M_t.
  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>.
  super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl = (RootSymbol *)0x0;
  this->sourceManager = (SourceManager *)0x0;
  *(undefined4 *)&(this->defaultTimeScale).base.magnitude = 0x10001;
  this->finalizing = false;
  this->typoCorrections = 0;
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  local_110 = &this->tempDiag;
  Diagnostic::Diagnostic(local_110,(DiagCode)0x0,(SourceLocation)0x0);
  (this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
  super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->cachedSemanticDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
  _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
  super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  ::sherwood_v3_table(&(this->udpMap).
                       super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
                     );
  local_120 = &this->gateMap;
  local_118 = &this->udpMap;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  ::sherwood_v3_table(&local_120->
                       super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
                     );
  local_128 = &this->bindDirectivesByDef;
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>
  ::sherwood_v3_table(&local_128->
                       super_sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>
                     );
  local_130 = &this->seenBindDirectives;
  ska::detailv3::
  sherwood_v3_table<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*>_>_>
  ::sherwood_v3_table(&local_130->
                       super_sherwood_v3_table<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*>_>_>
                     );
  local_138 = &this->paramOverrides;
  ParamOverrideNode::ParamOverrideNode(local_138);
  (this->dpiExports).
  super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dpiExports).
  super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dpiExports).
  super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140 = &this->packageExportCandidateMap;
  ska::detailv3::sherwood_v3_table<$b062436f$>::sherwood_v3_table
            (&local_140->super_sherwood_v3_table<_b062436f_>);
  local_148 = &this->defaultClockingMap;
  (this->nameConflicts).
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nameConflicts).
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->externInterfaceMethods).
  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nameConflicts).
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->externInterfaceMethods).
  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->externInterfaceMethods).
  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  ::sherwood_v3_table(&local_148->
                       super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
                     );
  local_150 = &this->globalClockingMap;
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  ::sherwood_v3_table(&local_150->
                       super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
                     );
  local_158 = &this->defaultDisableMap;
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>_>
  ::sherwood_v3_table(&local_158->
                       super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>_>
                     );
  (this->subroutineStorage).
  super__Vector_base<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>,_std::allocator<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->stdPkg = (PackageSymbol *)0x0;
  (this->subroutineStorage).
  super__Vector_base<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>,_std::allocator<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subroutineStorage).
  super__Vector_base<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>,_std::allocator<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8[0]._0_4_ = 0;
  pSVar6 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind>
                     (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  this->bitType = (Type *)pSVar6;
  local_1a8[0]._0_4_ = 1;
  pSVar6 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind>
                     (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  this->logicType = (Type *)pSVar6;
  local_1a8[0]._0_4_ = 1;
  pPVar7 = BumpAllocator::
           emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                     (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  this->intType = (Type *)pPVar7;
  local_1a8[0]._0_4_ = 3;
  pPVar7 = BumpAllocator::
           emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                     (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  this->byteType = (Type *)pPVar7;
  local_1a8[0]._0_4_ = 4;
  pPVar7 = BumpAllocator::
           emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                     (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  this->integerType = (Type *)pPVar7;
  local_1a8[0]._0_4_ = 0;
  pFVar8 = BumpAllocator::emplace<slang::ast::FloatingType,slang::ast::FloatingType::Kind>
                     (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  this->realType = &pFVar8->super_Type;
  local_1a8[0]._0_4_ = 1;
  pFVar8 = BumpAllocator::emplace<slang::ast::FloatingType,slang::ast::FloatingType::Kind>
                     (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  this->shortRealType = &pFVar8->super_Type;
  pTVar9 = &BumpAllocator::emplace<slang::ast::StringType>(&this->super_BumpAllocator)->super_Type;
  this->stringType = pTVar9;
  pTVar9 = &BumpAllocator::emplace<slang::ast::VoidType>(&this->super_BumpAllocator)->super_Type;
  this->voidType = pTVar9;
  pTVar9 = &BumpAllocator::emplace<slang::ast::ErrorType>(&this->super_BumpAllocator)->super_Type;
  this->errorType = pTVar9;
  local_1a8[0]._0_4_ = 2;
  pSVar6 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind>
                     (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  local_1a8[0]._0_4_ = 0;
  local_1b0._M_head_impl._0_1_ = (__0)0x1;
  local_80 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind,bool>
                       (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data,
                        (bool *)&local_1b0);
  local_1a8[0]._0_4_ = 1;
  local_1b0._M_head_impl._0_1_ = (__0)0x1;
  local_88 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind,bool>
                       (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data,
                        (bool *)&local_1b0);
  local_1a8[0]._0_4_ = 2;
  local_1b0._M_head_impl._0_1_ = (__0)0x1;
  local_90 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind,bool>
                       (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data,
                        (bool *)&local_1b0);
  local_1a8[0]._0_4_ = 0;
  pPVar7 = BumpAllocator::
           emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                     (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  local_1a8[0]._0_4_ = 2;
  pPVar10 = BumpAllocator::
            emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  local_1a8[0]._0_4_ = 5;
  pPVar11 = BumpAllocator::
            emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  local_1a8[0]._0_4_ = 2;
  pFVar8 = BumpAllocator::emplace<slang::ast::FloatingType,slang::ast::FloatingType::Kind>
                     (&this->super_BumpAllocator,(Kind *)local_1a8[0]._M_pod_data);
  local_188 = &BumpAllocator::emplace<slang::ast::CHandleType>(&this->super_BumpAllocator)->
               super_Type;
  local_48 = &BumpAllocator::emplace<slang::ast::NullType>(&this->super_BumpAllocator)->super_Type;
  local_50 = &BumpAllocator::emplace<slang::ast::EventType>(&this->super_BumpAllocator)->super_Type;
  local_58 = &BumpAllocator::emplace<slang::ast::UnboundedType>(&this->super_BumpAllocator)->
              super_Type;
  local_60 = &BumpAllocator::emplace<slang::ast::TypeRefType>(&this->super_BumpAllocator)->
              super_Type;
  local_68 = &BumpAllocator::emplace<slang::ast::UntypedType>(&this->super_BumpAllocator)->
              super_Type;
  local_70 = &BumpAllocator::emplace<slang::ast::SequenceType>(&this->super_BumpAllocator)->
              super_Type;
  local_78 = &BumpAllocator::emplace<slang::ast::PropertyType>(&this->super_BumpAllocator)->
              super_Type;
  local_1a8[0]._0_4_ = 0x192;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = (Type *)pPVar7;
  pTVar9 = this->intType;
  local_1a8[0]._0_4_ = 0xf1;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = pTVar9;
  local_1a8[0]._0_4_ = 0x10b;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = (Type *)pPVar10;
  pTVar9 = this->byteType;
  local_1a8[0]._0_4_ = 0x37;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = pTVar9;
  pTVar9 = this->bitType;
  local_1a8[0]._0_4_ = 0x34;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = pTVar9;
  pTVar9 = this->logicType;
  local_1a8[0]._0_4_ = 0x102;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = pTVar9;
  local_1a8[0]._0_4_ = 0x17b;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = (Type *)pSVar6;
  pTVar9 = this->integerType;
  local_1a8[0]._0_4_ = 0xf3;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = pTVar9;
  local_1a8[0]._0_4_ = 0x1ba;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = (Type *)pPVar11;
  pTVar9 = this->realType;
  local_1a8[0]._0_4_ = 0x17a;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = pTVar9;
  local_1a8[0]._0_4_ = 0x179;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = &pFVar8->super_Type;
  pTVar9 = this->shortRealType;
  local_1a8[0]._0_4_ = 0x193;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  this_01 = local_160;
  *ppTVar12 = pTVar9;
  pTVar9 = this->stringType;
  local_1a8[0]._0_4_ = 0x1a8;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = pTVar9;
  local_1a8[0]._0_4_ = 0x38;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = local_188;
  local_1a8[0]._0_4_ = 0x13a;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = local_48;
  pTVar9 = this->voidType;
  local_1a8[0]._0_4_ = 0x1ee;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = pTVar9;
  local_1a8[0]._0_4_ = 0xb3;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = local_50;
  local_1a8[0]._0_4_ = 0x1f5;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = local_58;
  local_1a8[0]._0_4_ = 0x1c6;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = local_60;
  local_1a8[0]._0_4_ = 0x1e7;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = local_68;
  local_1a8[0]._0_4_ = 400;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = local_70;
  local_1a8[0]._0_4_ = 0x16e;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = local_78;
  pTVar9 = this->errorType;
  auVar3._12_4_ = 0;
  auVar3._0_12_ = local_1a8[0]._4_12_;
  local_1a8[0] = (_Any_data)(auVar3 << 0x20);
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](this_00,(SyntaxKind *)local_1a8[0]._M_pod_data);
  *ppTVar12 = pTVar9;
  local_1b8._0_4_ = 1;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(WireKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x150;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 2;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(WAndKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x14a;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 3;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(WOrKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x153;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 4;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(TriKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x133;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 5;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(TriAndKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x136;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 6;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(TriOrKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x137;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 7;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(Tri0Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x134;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 8;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(Tri1Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x135;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 9;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(TriRegKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x138;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 10;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(Supply0Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x124;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 0xb;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(Supply1Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x125;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 0xc;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(UWireKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 0x143;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b8._0_4_ = 0xd;
  local_1a8[0] = (_Any_data)parsing::LexerFacts::getTokenKindText(InterconnectKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&local_1b0,(basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             (Type *)local_1a8);
  local_1b8._6_2_ = 200;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)(local_1b8 + 6));
  _Var4._M_head_impl = local_1b0._M_head_impl;
  local_1b0._M_head_impl = (NetType *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,_Var4._M_head_impl);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &local_1b0);
  local_1b0._M_head_impl = local_1b0._M_head_impl & 0xffffffff00000000;
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,char_const(&)[8],slang::ast::Type&>
            ((NetKind *)local_1a8[0]._M_pod_data,(char (*) [8])&local_1b0,(Type *)"<error>");
  local_1b8._0_4_ = local_1b8._0_4_ & 0xffff0000;
  p_Var13 = (__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)local_1b8);
  uVar5 = local_1a8[0]._M_unused._0_8_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_1a8[0]._8_8_;
  local_1a8[0] = (_Any_data)(auVar1 << 0x40);
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            (p_Var13,(pointer)uVar5);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)local_1a8
            );
  local_1a8[0]._0_2_ = 0x150;
  puVar14 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](this_01,(TokenKind *)local_1a8[0]._M_pod_data);
  this->wireNetType =
       (puVar14->_M_t).
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  local_1b0._M_head_impl = (NetType *)this;
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_1b0,this->bitType);
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_1b0,this->logicType);
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_1b0,pSVar6);
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_1b0,local_80);
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_1b0,local_88);
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_1b0,local_90);
  (this->defaultTimeScale).base.unit = Nanoseconds;
  (this->defaultTimeScale).base.magnitude = One;
  (this->defaultTimeScale).precision.unit = Nanoseconds;
  (this->defaultTimeScale).precision.magnitude = One;
  std::make_unique<slang::ast::RootSymbol,slang::ast::Compilation&>((Compilation *)local_1a8);
  uVar5 = local_1a8[0]._M_unused._0_8_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_1a8[0]._8_8_;
  local_1a8[0] = (_Any_data)(auVar2 << 0x40);
  std::__uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::reset
            ((__uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              *)local_170,(pointer)uVar5);
  std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::~unique_ptr
            ((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *)
             local_1a8);
  builtins::registerArrayMethods(this);
  builtins::registerConversionFuncs(this);
  builtins::registerCoverageFuncs(this);
  builtins::registerEnumMethods(this);
  builtins::registerMathFuncs(this);
  builtins::registerMiscSystemFuncs(this);
  builtins::registerNonConstFuncs(this);
  builtins::registerQueryFuncs(this);
  builtins::registerStringMethods(this);
  builtins::registerSystemTasks(this);
  pPVar15 = builtins::createStdPackage(this);
  this->stdPkg = pPVar15;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
  ::
  emplace<std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
            (local_168,&(pPVar15->super_Symbol).name,&this->stdPkg);
  builtins::registerGateTypes(this);
  std::make_unique<slang::ast::TypeArgFormatter>();
  std::__shared_ptr<slang::DiagArgFormatter,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::TypeArgFormatter,std::default_delete<slang::ast::TypeArgFormatter>,void>
            ((__shared_ptr<slang::DiagArgFormatter,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (unique_ptr<slang::ast::TypeArgFormatter,_std::default_delete<slang::ast::TypeArgFormatter>_>
              *)local_1a8);
  DiagnosticEngine::setDefaultFormatter<slang::ast::Type_const*>(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if ((long *)local_1a8[0]._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1a8[0]._0_8_ + 8))();
  }
  local_1a8[1]._0_8_ = TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._16_8_;
  local_1a8[0]._8_8_ = TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._8_8_;
  local_1a8[0]._M_unused._M_object = TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._0_8_;
  TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._0_8_ = 0;
  TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._8_8_ = 0;
  TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._16_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_slang::ast::Symbol_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Compilation.cpp:166:50)>
       ::_M_manager;
  local_1a8[1]._8_8_ = TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._24_8_;
  TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._24_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_slang::ast::Symbol_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Compilation.cpp:166:50)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)local_1a8);
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  return;
}

Assistant:

Compilation::Compilation(const Bag& options) :
    options(options.getOrDefault<CompilationOptions>()), tempDiag({}, {}) {

    // Construct all built-in types.
    bitType = emplace<ScalarType>(ScalarType::Bit);
    logicType = emplace<ScalarType>(ScalarType::Logic);
    intType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Int);
    byteType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Byte);
    integerType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Integer);
    realType = emplace<FloatingType>(FloatingType::Real);
    shortRealType = emplace<FloatingType>(FloatingType::ShortReal);
    stringType = emplace<StringType>();
    voidType = emplace<VoidType>();
    errorType = emplace<ErrorType>();

    auto regType = emplace<ScalarType>(ScalarType::Reg);
    auto signedBitType = emplace<ScalarType>(ScalarType::Bit, true);
    auto signedLogicType = emplace<ScalarType>(ScalarType::Logic, true);
    auto signedRegType = emplace<ScalarType>(ScalarType::Reg, true);
    auto shortIntType = emplace<PredefinedIntegerType>(PredefinedIntegerType::ShortInt);
    auto longIntType = emplace<PredefinedIntegerType>(PredefinedIntegerType::LongInt);
    auto timeType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Time);
    auto realTimeType = emplace<FloatingType>(FloatingType::RealTime);
    auto chandleType = emplace<CHandleType>();
    auto nullType = emplace<NullType>();
    auto eventType = emplace<EventType>();
    auto unboundedType = emplace<UnboundedType>();
    auto typeRefType = emplace<TypeRefType>();
    auto untypedType = emplace<UntypedType>();
    auto sequenceType = emplace<SequenceType>();
    auto propertyType = emplace<PropertyType>();

    // Register built-in types for lookup by syntax kind.
    knownTypes[SyntaxKind::ShortIntType] = shortIntType;
    knownTypes[SyntaxKind::IntType] = intType;
    knownTypes[SyntaxKind::LongIntType] = longIntType;
    knownTypes[SyntaxKind::ByteType] = byteType;
    knownTypes[SyntaxKind::BitType] = bitType;
    knownTypes[SyntaxKind::LogicType] = logicType;
    knownTypes[SyntaxKind::RegType] = regType;
    knownTypes[SyntaxKind::IntegerType] = integerType;
    knownTypes[SyntaxKind::TimeType] = timeType;
    knownTypes[SyntaxKind::RealType] = realType;
    knownTypes[SyntaxKind::RealTimeType] = realTimeType;
    knownTypes[SyntaxKind::ShortRealType] = shortRealType;
    knownTypes[SyntaxKind::StringType] = stringType;
    knownTypes[SyntaxKind::CHandleType] = chandleType;
    knownTypes[SyntaxKind::NullLiteralExpression] = nullType;
    knownTypes[SyntaxKind::VoidType] = voidType;
    knownTypes[SyntaxKind::EventType] = eventType;
    knownTypes[SyntaxKind::WildcardLiteralExpression] = unboundedType;
    knownTypes[SyntaxKind::TypeReference] = typeRefType;
    knownTypes[SyntaxKind::Untyped] = untypedType;
    knownTypes[SyntaxKind::SequenceType] = sequenceType;
    knownTypes[SyntaxKind::PropertyType] = propertyType;
    knownTypes[SyntaxKind::Unknown] = errorType;

#define MAKE_NETTYPE(type)                                               \
    knownNetTypes[TokenKind::type##Keyword] = std::make_unique<NetType>( \
        NetType::type, LexerFacts::getTokenKindText(TokenKind::type##Keyword), *logicType)

    MAKE_NETTYPE(Wire);
    MAKE_NETTYPE(WAnd);
    MAKE_NETTYPE(WOr);
    MAKE_NETTYPE(Tri);
    MAKE_NETTYPE(TriAnd);
    MAKE_NETTYPE(TriOr);
    MAKE_NETTYPE(Tri0);
    MAKE_NETTYPE(Tri1);
    MAKE_NETTYPE(TriReg);
    MAKE_NETTYPE(Supply0);
    MAKE_NETTYPE(Supply1);
    MAKE_NETTYPE(UWire);
    MAKE_NETTYPE(Interconnect);

    knownNetTypes[TokenKind::Unknown] = std::make_unique<NetType>(NetType::Unknown, "<error>",
                                                                  *logicType);
    wireNetType = knownNetTypes[TokenKind::WireKeyword].get();

#undef MAKE_NETTYPE

    // Scalar types are indexed by bit flags.
    auto registerScalar = [this](auto type) {
        scalarTypeTable[type->getIntegralFlags().bits() & 0x7] = type;
    };
    registerScalar(bitType);
    registerScalar(logicType);
    registerScalar(regType);
    registerScalar(signedBitType);
    registerScalar(signedLogicType);
    registerScalar(signedRegType);

    defaultTimeScale.base = {TimeUnit::Nanoseconds, TimeScaleMagnitude::One};
    defaultTimeScale.precision = {TimeUnit::Nanoseconds, TimeScaleMagnitude::One};

    root = std::make_unique<RootSymbol>(*this);

    // Register all system tasks, functions, and methods.
    builtins::registerArrayMethods(*this);
    builtins::registerConversionFuncs(*this);
    builtins::registerCoverageFuncs(*this);
    builtins::registerEnumMethods(*this);
    builtins::registerMathFuncs(*this);
    builtins::registerMiscSystemFuncs(*this);
    builtins::registerNonConstFuncs(*this);
    builtins::registerQueryFuncs(*this);
    builtins::registerStringMethods(*this);
    builtins::registerSystemTasks(*this);

    // Register the built-in std package.
    stdPkg = &builtins::createStdPackage(*this);
    packageMap.emplace(stdPkg->name, stdPkg);

    // Register the built-in gate types.
    builtins::registerGateTypes(*this);

    // Set a default handler for printing types and symbol paths, for convenience.
    DiagnosticEngine::setDefaultFormatter<const Type*>(std::make_unique<TypeArgFormatter>());
    TextDiagnosticClient::setDefaultSymbolPathCB([](const Symbol& sym) {
        std::string str;
        sym.getHierarchicalPath(str);
        return str;
    });

    // Reset systemId counters that may have been changed due to creation of types
    // in the std package.
    nextEnumSystemId = 1;
    nextStructSystemId = 1;
    nextUnionSystemId = 1;
}